

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int rebuild_ch_inner_extensions
              (ptls_buffer_t *buf,uint8_t **src,uint8_t *end,uint8_t *outer_ext,
              uint8_t *outer_ext_end)

{
  ushort *src_00;
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  ushort uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t local_5c;
  uint8_t local_5b;
  uint8_t local_5a;
  uint8_t local_59;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  size_t local_40;
  size_t local_38;
  
  iVar4 = ptls_buffer__do_pushv(buf,"",2);
  if (iVar4 == 0) {
    puVar11 = *src;
    iVar4 = 0x32;
    if (1 < (ulong)((long)end - (long)puVar11)) {
      local_38 = buf->off;
      *src = puVar11 + 1;
      uVar1 = *puVar11;
      local_48 = puVar11 + 2;
      *src = local_48;
      if ((ulong)CONCAT11(uVar1,puVar11[1]) <= (ulong)((long)end - (long)local_48)) {
        local_48 = local_48 + CONCAT11(uVar1,puVar11[1]);
        do {
          puVar11 = *src;
          if (puVar11 == local_48) {
            uVar7 = buf->off - local_38;
            if (uVar7 < 0x10000) {
              buf->base[local_38 - 2] = (uint8_t)(uVar7 >> 8);
              buf->base[local_38 - 1] = (uint8_t)uVar7;
              return 0;
            }
            return 0x20c;
          }
          if ((long)local_48 - (long)puVar11 < 2) {
            return 0x32;
          }
          uVar1 = *puVar11;
          uVar2 = puVar11[1];
          *src = puVar11 + 2;
          if ((ulong)((long)local_48 - (long)(puVar11 + 2)) < 2) {
            return 0x32;
          }
          *src = puVar11 + 3;
          uVar3 = puVar11[2];
          puVar10 = puVar11 + 4;
          *src = puVar10;
          uVar7 = (ulong)CONCAT11(uVar3,puVar11[3]);
          if ((ulong)((long)local_48 - (long)puVar10) < uVar7) {
            return 0x32;
          }
          puVar10 = puVar10 + uVar7;
          if (CONCAT11(uVar1,uVar2) == -0x300) {
            if (uVar7 == 0) {
              return 0x32;
            }
            puVar8 = puVar11 + 5;
            *src = puVar8;
            if ((ulong)((long)puVar10 - (long)puVar8) < (ulong)puVar11[4]) {
              return 0x32;
            }
            puVar12 = puVar8 + puVar11[4];
            do {
              if ((long)puVar12 - (long)puVar8 < 2) {
                return 0x32;
              }
              uVar1 = *puVar8;
              uVar2 = puVar8[1];
              uVar9 = CONCAT11(uVar1,uVar2);
              *src = puVar8 + 2;
              if (uVar9 == 0xfe0d) {
                return 0x2f;
              }
              while( true ) {
                if ((long)outer_ext_end - (long)outer_ext < 2) {
                  return 0x2f;
                }
                if (((long)outer_ext_end - (long)outer_ext) + -2 < 2) {
                  return 0x2f;
                }
                uVar7 = (ulong)(ushort)(*(ushort *)((long)outer_ext + 2) << 8 |
                                       *(ushort *)((long)outer_ext + 2) >> 8);
                src_00 = (ushort *)((long)outer_ext + 4);
                if ((long)outer_ext_end - (long)src_00 < (long)uVar7) {
                  __assert_fail("outer_ext_end - outer_ext >= outersize",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                                ,0xf63,
                                "int rebuild_ch_inner_extensions(ptls_buffer_t *, const uint8_t **, const uint8_t *const, const uint8_t *, const uint8_t *)"
                               );
                }
                if ((ushort)(*(ushort *)outer_ext << 8 | *(ushort *)outer_ext >> 8) == uVar9) break;
                outer_ext = (uint8_t *)((long)src_00 + uVar7);
              }
              local_5a = uVar1;
              local_59 = uVar2;
              local_58 = puVar12;
              local_50 = puVar10;
              iVar5 = ptls_buffer__do_pushv(buf,&local_5a,2);
              if (iVar5 != 0) {
                return iVar5;
              }
              iVar5 = ptls_buffer__do_pushv(buf,"",2);
              if (iVar5 != 0) {
                return iVar5;
              }
              local_40 = buf->off;
              iVar5 = ptls_buffer__do_pushv(buf,src_00,uVar7);
              if (iVar5 != 0) {
                return iVar5;
              }
              uVar6 = buf->off - local_40;
              if (0xffff < uVar6) {
                return 0x20c;
              }
              outer_ext = (uint8_t *)((long)src_00 + uVar7);
              buf->base[local_40 - 2] = (uint8_t)(uVar6 >> 8);
              buf->base[local_40 - 1] = (uint8_t)uVar6;
              puVar8 = *src;
              puVar10 = local_50;
              puVar11 = local_50;
              puVar12 = local_58;
            } while (puVar8 != local_58);
          }
          else {
            local_5c = uVar1;
            local_5b = uVar2;
            local_50 = puVar10;
            iVar5 = ptls_buffer__do_pushv(buf,&local_5c,2);
            if (iVar5 != 0) {
              return iVar5;
            }
            iVar5 = ptls_buffer__do_pushv(buf,"",2);
            puVar11 = local_50;
            if (iVar5 != 0) {
              return iVar5;
            }
            local_58 = (uint8_t *)buf->off;
            iVar5 = ptls_buffer__do_pushv(buf,*src,(long)local_50 - (long)*src);
            if (iVar5 != 0) {
              return iVar5;
            }
            *src = puVar11;
            uVar7 = buf->off - (long)local_58;
            if (0xffff < uVar7) {
              return 0x20c;
            }
            local_58[(long)(buf->base + -2)] = (uint8_t)(uVar7 >> 8);
            local_58[(long)(buf->base + -1)] = (uint8_t)uVar7;
            puVar12 = *src;
          }
        } while (puVar12 == puVar11);
      }
    }
  }
  return iVar4;
}

Assistant:

static int rebuild_ch_inner_extensions(ptls_buffer_t *buf, const uint8_t **src, const uint8_t *const end, const uint8_t *outer_ext,
                                       const uint8_t *outer_ext_end)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_decode_open_block(*src, end, 2, {
            while (*src != end) {
                uint16_t exttype;
                if ((ret = ptls_decode16(&exttype, src, end)) != 0)
                    goto Exit;
                ptls_decode_open_block(*src, end, 2, {
                    if (exttype == PTLS_EXTENSION_TYPE_ECH_OUTER_EXTENSIONS) {
                        ptls_decode_open_block(*src, end, 1, {
                            do {
                                uint16_t reftype;
                                uint16_t outertype;
                                uint16_t outersize;
                                if ((ret = ptls_decode16(&reftype, src, end)) != 0)
                                    goto Exit;
                                if (reftype == PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO) {
                                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                    goto Exit;
                                }
                                while (1) {
                                    if (ptls_decode16(&outertype, &outer_ext, outer_ext_end) != 0 ||
                                        ptls_decode16(&outersize, &outer_ext, outer_ext_end) != 0) {
                                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                        goto Exit;
                                    }
                                    assert(outer_ext_end - outer_ext >= outersize);
                                    if (outertype == reftype)
                                        break;
                                    outer_ext += outersize;
                                }
                                buffer_push_extension(buf, reftype, {
                                    ptls_buffer_pushv(buf, outer_ext, outersize);
                                    outer_ext += outersize;
                                });
                            } while (*src != end);
                        });
                    } else {
                        buffer_push_extension(buf, exttype, {
                            ptls_buffer_pushv(buf, *src, end - *src);
                            *src = end;
                        });
                    }
                });
            }
        });
    });

Exit:
    return ret;
}